

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::GeluLayerParams::SerializeWithCachedSizes
          (GeluLayerParams *this,CodedOutputStream *output)

{
  GeluLayerParams_GeluMode GVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  GeluLayerParams *this_local;
  
  GVar1 = mode(this);
  if (GVar1 != GeluLayerParams_GeluMode_EXACT) {
    GVar1 = mode(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,GVar1,output);
  }
  return;
}

Assistant:

void GeluLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.GeluLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.GeluLayerParams.GeluMode mode = 1;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->mode(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.GeluLayerParams)
}